

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cd03::XmlTestReporterFixtureEmptyReportSummaryFormatHelper::
XmlTestReporterFixtureEmptyReportSummaryFormatHelper
          (XmlTestReporterFixtureEmptyReportSummaryFormatHelper *this,TestDetails *details)

{
  TestDetails *details_local;
  XmlTestReporterFixtureEmptyReportSummaryFormatHelper *this_local;
  
  XmlTestReporterFixture::XmlTestReporterFixture(&this->super_XmlTestReporterFixture);
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, EmptyReportSummaryFormat)
{
    reporter.ReportSummary(0, 0, 0, 0.1f);

    const char *expected =
"<?xml version=\"1.0\"?>"
"<unittest-results tests=\"0\" failedtests=\"0\" failures=\"0\" time=\"0.1\">"
"</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}